

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariable.cpp
# Opt level: O1

void __thiscall
rsg::Variable::tokenizeDeclaration(Variable *this,GeneratorState *state,TokenStream *str)

{
  size_t sVar1;
  Version VVar2;
  Type TVar3;
  size_t sVar4;
  TokenStream *pTVar5;
  Token local_78;
  Token local_68;
  Token local_58;
  Token local_48;
  Token local_38;
  Token local_28;
  
  if (6 < this->m_storage - STORAGE_SHADER_IN) goto LAB_019acdec;
  VVar2 = state->m_programParams->version;
  switch(this->m_storage) {
  case STORAGE_SHADER_IN:
    if (0 < (int)VVar2) {
      if (-1 < this->m_layoutLocation) {
        local_78.m_type = LAYOUT;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                    (&str->m_tokens,str->m_numTokens + 0x40);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
        sVar4 = str->m_numTokens;
        sVar1 = sVar4 + 1;
        str->m_numTokens = sVar1;
        local_68.m_type = LEFT_PAREN;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == sVar1) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_68);
        sVar4 = str->m_numTokens;
        sVar1 = sVar4 + 1;
        str->m_numTokens = sVar1;
        local_28.m_type = LOCATION;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == sVar1) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_28);
        sVar4 = str->m_numTokens;
        sVar1 = sVar4 + 1;
        str->m_numTokens = sVar1;
        local_38.m_type = EQUAL;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == sVar1) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_38);
        sVar4 = str->m_numTokens;
        sVar1 = sVar4 + 1;
        str->m_numTokens = sVar1;
        local_58.m_arg.floatValue = (float)this->m_layoutLocation;
        local_58.m_type = INT_LITERAL;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == sVar1) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_58);
        sVar4 = str->m_numTokens;
        sVar1 = sVar4 + 1;
        str->m_numTokens = sVar1;
        local_48.m_type = RIGHT_PAREN;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == sVar1) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_48);
        str->m_numTokens = str->m_numTokens + 1;
        Token::~Token(&local_48);
        Token::~Token(&local_58);
        Token::~Token(&local_38);
        Token::~Token(&local_28);
        Token::~Token(&local_68);
        Token::~Token(&local_78);
      }
      local_78.m_type = IN;
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
      str->m_numTokens = str->m_numTokens + 1;
      Token::~Token(&local_78);
      if (state->m_shader->m_type != TYPE_FRAGMENT) goto LAB_019acdec;
      local_78.m_type = MEDIUM_PRECISION;
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
      break;
    }
    TVar3 = state->m_shader->m_type;
    if (TVar3 == TYPE_FRAGMENT) {
      local_78.m_type = VARYING;
      pTVar5 = TokenStream::operator<<(str,&local_78);
      local_68.m_type = MEDIUM_PRECISION;
      TokenStream::operator<<(pTVar5,&local_68);
      goto LAB_019acd5e;
    }
    if (TVar3 != TYPE_VERTEX) goto LAB_019acdec;
    local_78.m_type = ATTRIBUTE;
    TokenStream::operator<<(str,&local_78);
    goto LAB_019acde4;
  case STORAGE_SHADER_OUT:
    if ((int)VVar2 < 1) {
      if (state->m_shader->m_type != TYPE_VERTEX) goto LAB_019acdec;
      local_78.m_type = VARYING;
      pTVar5 = TokenStream::operator<<(str,&local_78);
      local_68.m_type = MEDIUM_PRECISION;
      TokenStream::operator<<(pTVar5,&local_68);
    }
    else {
      if (-1 < this->m_layoutLocation) {
        local_78.m_type = LAYOUT;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                    (&str->m_tokens,str->m_numTokens + 0x40);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
        sVar4 = str->m_numTokens;
        sVar1 = sVar4 + 1;
        str->m_numTokens = sVar1;
        local_68.m_type = LEFT_PAREN;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == sVar1) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_68);
        sVar4 = str->m_numTokens;
        sVar1 = sVar4 + 1;
        str->m_numTokens = sVar1;
        local_28.m_type = LOCATION;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == sVar1) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_28);
        sVar4 = str->m_numTokens;
        sVar1 = sVar4 + 1;
        str->m_numTokens = sVar1;
        local_38.m_type = EQUAL;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == sVar1) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_38);
        sVar4 = str->m_numTokens;
        sVar1 = sVar4 + 1;
        str->m_numTokens = sVar1;
        local_58.m_arg.floatValue = (float)this->m_layoutLocation;
        local_58.m_type = INT_LITERAL;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == sVar1) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_58);
        sVar4 = str->m_numTokens;
        sVar1 = sVar4 + 1;
        str->m_numTokens = sVar1;
        local_48.m_type = RIGHT_PAREN;
        if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == sVar1) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
        }
        Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_48);
        str->m_numTokens = str->m_numTokens + 1;
        Token::~Token(&local_48);
        Token::~Token(&local_58);
        Token::~Token(&local_38);
        Token::~Token(&local_28);
        Token::~Token(&local_68);
        Token::~Token(&local_78);
      }
      local_78.m_type = OUT;
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
      sVar4 = str->m_numTokens;
      sVar1 = sVar4 + 1;
      str->m_numTokens = sVar1;
      local_68.m_type = MEDIUM_PRECISION;
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == sVar1) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_68);
      str->m_numTokens = str->m_numTokens + 1;
    }
LAB_019acd5e:
    Token::~Token(&local_68);
    goto LAB_019acde4;
  case STORAGE_UNIFORM:
    local_78.m_type = UNIFORM;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                (&str->m_tokens,str->m_numTokens + 0x40);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
    str->m_numTokens = str->m_numTokens + 1;
    Token::~Token(&local_78);
    if (1 < (this->m_type).m_baseType - TYPE_FLOAT) goto LAB_019acdec;
    local_78.m_type = MEDIUM_PRECISION;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                (&str->m_tokens,str->m_numTokens + 0x40);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
    break;
  case STORAGE_CONST:
    local_78.m_type = CONST;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                (&str->m_tokens,str->m_numTokens + 0x40);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
    break;
  case STORAGE_PARAMETER_IN:
    local_78.m_type = IN;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                (&str->m_tokens,str->m_numTokens + 0x40);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
    break;
  case STORAGE_PARAMETER_OUT:
    local_78.m_type = OUT;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                (&str->m_tokens,str->m_numTokens + 0x40);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
    break;
  case STORAGE_PARAMETER_INOUT:
    local_78.m_type = INOUT;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                (&str->m_tokens,str->m_numTokens + 0x40);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
  }
  str->m_numTokens = str->m_numTokens + 1;
LAB_019acde4:
  Token::~Token(&local_78);
LAB_019acdec:
  VariableType::tokenizeShortType(&this->m_type,str);
  Token::Token(&local_78,(this->m_name)._M_dataplus._M_p);
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&str->m_tokens,str->m_numTokens + 0x40);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_78);
  return;
}

Assistant:

void Variable::tokenizeDeclaration (GeneratorState& state, TokenStream& str) const
{
	Version targetVersion = state.getProgramParameters().version;

	// \todo [2011-03-10 pyry] Remove precision hacks once precision handling is implemented
	switch (m_storage)
	{
		case STORAGE_CONST:				str << Token::CONST;		break;
		case STORAGE_PARAMETER_IN:		str << Token::IN;			break;
		case STORAGE_PARAMETER_OUT:		str << Token::OUT;			break;
		case STORAGE_PARAMETER_INOUT:	str << Token::INOUT;		break;

		case STORAGE_UNIFORM:
		{
			str << Token::UNIFORM;
			if (m_type.isFloatOrVec() || m_type.isIntOrVec())
				str << Token::MEDIUM_PRECISION;
			break;
		}

		case STORAGE_SHADER_IN:
		{
			if (targetVersion >= VERSION_300)
			{
				if (hasLayoutLocation())
					str << Token::LAYOUT << Token::LEFT_PAREN << Token::LOCATION << Token::EQUAL << m_layoutLocation << Token::RIGHT_PAREN;

				str << Token::IN;

				if (state.getShader().getType() == Shader::TYPE_FRAGMENT)
					str << Token::MEDIUM_PRECISION;
			}
			else
			{
				DE_ASSERT(!hasLayoutLocation());

				switch (state.getShader().getType())
				{
					case Shader::TYPE_VERTEX:	str << Token::ATTRIBUTE;								break;
					case Shader::TYPE_FRAGMENT:	str << Token::VARYING << Token::MEDIUM_PRECISION;		break;
					default:					DE_ASSERT(DE_FALSE);									break;
				}
			}
			break;
		}

		case STORAGE_SHADER_OUT:
		{
			if (targetVersion >= VERSION_300)
			{
				if (hasLayoutLocation())
					str << Token::LAYOUT << Token::LEFT_PAREN << Token::LOCATION << Token::EQUAL << m_layoutLocation << Token::RIGHT_PAREN;

				str << Token::OUT << Token::MEDIUM_PRECISION;
			}
			else
			{
				DE_ASSERT(!hasLayoutLocation());

				if (state.getShader().getType() == Shader::TYPE_VERTEX)
					str << Token::VARYING << Token::MEDIUM_PRECISION;
				else
					DE_ASSERT(DE_FALSE);
			}
			break;
		}

		case STORAGE_LOCAL:
		default:
			/* nothing */
			break;
	}

	m_type.tokenizeShortType(str);

	DE_ASSERT(m_name != "");
	str << Token(m_name.c_str());
}